

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_recursive_cte.cpp
# Opt level: O1

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalCTERef *op)

{
  idx_t *piVar1;
  iterator __position;
  __node_base_ptr p_Var2;
  pointer pPVar3;
  __node_base_ptr p_Var4;
  PhysicalOperator *pPVar5;
  InvalidInputException *pIVar6;
  _Hash_node_base *p_Var7;
  _Hash_node_base *p_Var8;
  PhysicalOperator *unaff_R15;
  PhysicalOperatorType op_type;
  undefined1 local_50 [32];
  
  if (op->materialized_cte == CTE_MATERIALIZE_ALWAYS) {
    piVar1 = &op->cte_index;
    p_Var8 = (_Hash_node_base *)0x0;
    p_Var2 = ::std::
             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::_M_find_before_node
                       (&(this->materialized_ctes)._M_h,
                        op->cte_index % (this->materialized_ctes)._M_h._M_bucket_count,piVar1,
                        op->cte_index);
    if (p_Var2 != (__node_base_ptr)0x0) {
      p_Var8 = p_Var2->_M_nxt;
    }
    if (p_Var8 != (_Hash_node_base *)0x0) {
      local_50[0] = 0x1b;
      pPVar3 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
               operator->(&this->physical_plan);
      unaff_R15 = PhysicalPlan::
                  Make<duckdb::PhysicalColumnDataScan,duckdb::vector<duckdb::LogicalType,true>&,duckdb::PhysicalOperatorType,unsigned_long&,unsigned_long&>
                            (pPVar3,&op->chunk_types,local_50,
                             &(op->super_LogicalOperator).estimated_cardinality,piVar1);
      p_Var7 = (_Hash_node_base *)0x0;
      p_Var4 = ::std::
               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         (&(this->recursive_cte_tables)._M_h,
                          op->cte_index % (this->recursive_cte_tables)._M_h._M_bucket_count,piVar1,
                          op->cte_index);
      if (p_Var4 != (__node_base_ptr)0x0) {
        p_Var7 = p_Var4->_M_nxt;
      }
      if (p_Var7 == (_Hash_node_base *)0x0) {
        pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_50._0_8_ = local_50 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"Referenced materialized CTE does not exist.","");
        InvalidInputException::InvalidInputException(pIVar6,(string *)local_50);
        __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      p_Var7 = p_Var7[2]._M_nxt;
      ::std::
      __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
      ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
               *)(unaff_R15 + 1),(pointer)0x0);
      *(_Hash_node_base **)&unaff_R15[1].type = p_Var7;
      __position._M_current = (reference_wrapper<const_duckdb::PhysicalOperator> *)p_Var8[3]._M_nxt;
      local_50._0_8_ = unaff_R15;
      if (__position._M_current ==
          (reference_wrapper<const_duckdb::PhysicalOperator> *)p_Var8[4]._M_nxt) {
        ::std::
        vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
        ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator_const>>
                  ((vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
                    *)(p_Var8 + 2),__position,
                   (reference_wrapper<const_duckdb::PhysicalOperator> *)local_50);
      }
      else {
        (__position._M_current)->_M_data = unaff_R15;
        p_Var8[3]._M_nxt = p_Var8[3]._M_nxt + 1;
      }
    }
    if (p_Var8 != (_Hash_node_base *)0x0) {
      return unaff_R15;
    }
  }
  piVar1 = &op->cte_index;
  p_Var8 = (_Hash_node_base *)0x0;
  p_Var4 = ::std::
           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     (&(this->recursive_cte_tables)._M_h,
                      op->cte_index % (this->recursive_cte_tables)._M_h._M_bucket_count,piVar1,
                      op->cte_index);
  if (p_Var4 != (__node_base_ptr)0x0) {
    p_Var8 = p_Var4->_M_nxt;
  }
  if (p_Var8 == (_Hash_node_base *)0x0) {
    pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_50._0_8_ = local_50 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Referenced recursive CTE does not exist.","");
    InvalidInputException::InvalidInputException(pIVar6,(string *)local_50);
    __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (op->is_recurring == true) {
    p_Var8 = (_Hash_node_base *)0x0;
    p_Var4 = ::std::
             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::_M_find_before_node
                       (&(this->recurring_cte_tables)._M_h,
                        *piVar1 % (this->recurring_cte_tables)._M_h._M_bucket_count,piVar1,*piVar1);
    if (p_Var4 != (__node_base_ptr)0x0) {
      p_Var8 = p_Var4->_M_nxt;
    }
    if (p_Var8 == (_Hash_node_base *)0x0) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_50._0_8_ = local_50 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"RECURRING can only be used with USING KEY in recursive CTE.",""
                );
      InvalidInputException::InvalidInputException(pIVar6,(string *)local_50);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  p_Var7 = p_Var8[2]._M_nxt;
  local_50[0] = op->is_recurring + '\x19';
  pPVar3 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
           operator->(&this->physical_plan);
  pPVar5 = PhysicalPlan::
           Make<duckdb::PhysicalColumnDataScan,duckdb::vector<duckdb::LogicalType,true>&,duckdb::PhysicalOperatorType&,unsigned_long&,unsigned_long&>
                     (pPVar3,(vector<duckdb::LogicalType,_true> *)(p_Var7 + 2),local_50,
                      &(op->super_LogicalOperator).estimated_cardinality,piVar1);
  p_Var8 = p_Var8[2]._M_nxt;
  ::std::
  __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
           *)(pPVar5 + 1),(pointer)0x0);
  *(_Hash_node_base **)&pPVar5[1].type = p_Var8;
  return pPVar5;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalCTERef &op) {
	D_ASSERT(op.children.empty());

	// Check if this LogicalCTERef is supposed to scan a materialized CTE.
	if (op.materialized_cte == CTEMaterialize::CTE_MATERIALIZE_ALWAYS) {
		// Lookup if there is a materialized CTE for the cte_index.
		auto materialized_cte = materialized_ctes.find(op.cte_index);

		// If this check fails, this is a reference to a materialized recursive CTE.
		if (materialized_cte != materialized_ctes.end()) {
			auto &chunk_scan = Make<PhysicalColumnDataScan>(op.chunk_types, PhysicalOperatorType::CTE_SCAN,
			                                                op.estimated_cardinality, op.cte_index);

			auto cte = recursive_cte_tables.find(op.cte_index);
			if (cte == recursive_cte_tables.end()) {
				throw InvalidInputException("Referenced materialized CTE does not exist.");
			}

			auto &cast_chunk_scan = chunk_scan.Cast<PhysicalColumnDataScan>();
			cast_chunk_scan.collection = cte->second.get();
			materialized_cte->second.push_back(cast_chunk_scan);
			return chunk_scan;
		}
	}

	// CreatePlan of a LogicalRecursiveCTE must have happened before.
	auto cte = recursive_cte_tables.find(op.cte_index);
	if (cte == recursive_cte_tables.end()) {
		throw InvalidInputException("Referenced recursive CTE does not exist.");
	}

	// If we found a recursive CTE and we want to scan the recurring table, we search for it,
	if (op.is_recurring) {
		cte = recurring_cte_tables.find(op.cte_index);
		if (cte == recurring_cte_tables.end()) {
			throw InvalidInputException("RECURRING can only be used with USING KEY in recursive CTE.");
		}
	}

	auto &types = cte->second.get()->Types();
	auto op_type =
	    op.is_recurring ? PhysicalOperatorType::RECURSIVE_RECURRING_CTE_SCAN : PhysicalOperatorType::RECURSIVE_CTE_SCAN;
	auto &chunk_scan = Make<PhysicalColumnDataScan>(types, op_type, op.estimated_cardinality, op.cte_index);
	auto &cast_chunk_scan = chunk_scan.Cast<PhysicalColumnDataScan>();
	cast_chunk_scan.collection = cte->second.get();
	return chunk_scan;
}